

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

int make_socket_non_block(int sfd)

{
  uint uVar1;
  int iVar2;
  char *__format;
  undefined8 uStack_20;
  
  uVar1 = fcntl(sfd,3);
  if (uVar1 == 0xffffffff) {
    __format = "\x1b[31mERROR: %s: %s: %d: cannot get socket flags!\x1b[m\n";
    uStack_20 = 0x43;
  }
  else {
    iVar2 = fcntl(sfd,4,(ulong)(uVar1 | 0x800));
    if (iVar2 != -1) {
      return 0;
    }
    __format = "\x1b[31mERROR: %s: %s: %d: cannot set socket flags!\x1b[m\n";
    uStack_20 = 0x4b;
  }
  printf(__format,"epoll.cpp","make_socket_non_block",uStack_20);
  sk_on_global_error();
  return -1;
}

Assistant:

static int make_socket_non_block(int sfd)
{
    int flags, res;

    flags = fcntl(sfd, F_GETFL);
    if (flags == -1) {
        LOGE("cannot get socket flags!");
        sk_on_global_error();
        return -1;
    }

    flags |= O_NONBLOCK;
    res = fcntl(sfd, F_SETFL, flags);
    if (res == -1) {
        LOGE("cannot set socket flags!");
        sk_on_global_error();
        return -1;
    }

    return 0;
}